

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScParser.cpp
# Opt level: O0

bool __thiscall ScParser::parseFunctionCall(ScParser *this,char **data)

{
  bool bVar1;
  ScName target;
  char **data_local;
  ScParser *this_local;
  
  if ((this->m_hasCurrentState & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = expectStartsWith<49ul>
                      (data,(char (*) [49])"boost::statechart::detail::safe_reaction_result ");
    if (!bVar1) {
      expectStartsWith<44ul>(data,(char (*) [44])"boost::statechart::detail::reaction_result ");
    }
    bVar1 = expectStartsWith<33ul>(data,(char (*) [33])"boost::statechart::simple_state<");
    if (bVar1) {
      matchAngleArgument(data,true);
      bVar1 = expectStartsWith<11ul>(data,(char (*) [11])"::transit<");
      if (bVar1) {
        matchTransitionTarget((ScTarget *)&stack0xffffffffffffffb8,data);
        ScModel::addTransition
                  (this->m_model,(ScName *)&stack0xffffffffffffffb8,&this->m_currentEvent,
                   target.field_2._8_4_);
        ScTarget::~ScTarget((ScTarget *)&stack0xffffffffffffffb8);
      }
      else {
        bVar1 = expectStartsWith<18ul>(data,(char (*) [18])"::discard_event()");
        if (bVar1) {
          ScModel::addTransition(this->m_model,&this->m_currentState,&this->m_currentEvent,None);
        }
        else {
          bVar1 = expectStartsWith<16ul>(data,(char (*) [16])"::defer_event()");
          if (bVar1) {
            ScModel::addDeferral(this->m_model,&this->m_currentEvent);
          }
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ScParser::parseFunctionCall(char *&data)
{
    if (!m_hasCurrentState) {
        return false;
    }

    // boost::statechart::detail::safe_reaction_result
    //     boost::statechart::simple_state<...>::transit<*state-name*>()

    if (!expectStartsWith(data, "boost::statechart::detail::safe_reaction_result ")) {
        expectStartsWith(data, "boost::statechart::detail::reaction_result ");
    }
    if (expectStartsWith(data, "boost::statechart::simple_state<")) {
        matchAngleArgument(data, true);
        if (expectStartsWith(data, "::transit<")) {
            auto [target, historyMode] = matchTransitionTarget(data);
            m_model.addTransition(target, m_currentEvent, historyMode);
        } else if (expectStartsWith(data, "::discard_event()")) {
            m_model.addTransition(m_currentState, m_currentEvent);
        } else if (expectStartsWith(data, "::defer_event()")) {
            m_model.addDeferral(m_currentEvent);
        }
        return true;
    }
    return false;
}